

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

size_t __thiscall edition_unittest::Int32ParseTester::ByteSizeLong(Int32ParseTester *this)

{
  uint uVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  sVar4 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_int32_lowfield_,1,
                     &(this->field_0)._impl_._repeated_int32_lowfield_cached_byte_size_);
  sVar5 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_int32_lowfield_,1,
                     &(this->field_0)._impl_._packed_int32_lowfield_cached_byte_size_);
  sVar6 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_int32_midfield_,2,
                     &(this->field_0)._impl_._repeated_int32_midfield_cached_byte_size_);
  sVar7 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_int32_midfield_,2,
                     &(this->field_0)._impl_._packed_int32_midfield_cached_byte_size_);
  sVar8 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_int32_hifield_,4,
                     &(this->field_0)._impl_._repeated_int32_hifield_cached_byte_size_);
  sVar9 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_int32_hifield_,4,
                     &(this->field_0)._impl_._packed_int32_hifield_cached_byte_size_);
  sVar3 = sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + sVar3;
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar10 = (long)(this->field_0)._impl_.optional_int32_lowfield_ | 1;
      lVar2 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 2) != 0) {
      uVar10 = (long)(this->field_0)._impl_.optional_int32_midfield_ | 1;
      lVar2 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 & 4) != 0) {
      uVar10 = (long)(this->field_0)._impl_.other_field_ | 1;
      lVar2 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 & 8) != 0) {
      uVar10 = (long)(this->field_0)._impl_.optional_int32_hifield_ | 1;
      lVar2 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 4;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t Int32ParseTester::ByteSizeLong() const {
  const Int32ParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.Int32ParseTester)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32_lowfield = 2;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32_lowfield(), 1,
              this_._impl_._repeated_int32_lowfield_cached_byte_size_);
    }
    // repeated int32 packed_int32_lowfield = 3 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32_lowfield(), 1,
              this_._impl_._packed_int32_lowfield_cached_byte_size_);
    }
    // repeated int32 repeated_int32_midfield = 1002;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32_midfield(), 2,
              this_._impl_._repeated_int32_midfield_cached_byte_size_);
    }
    // repeated int32 packed_int32_midfield = 1003 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32_midfield(), 2,
              this_._impl_._packed_int32_midfield_cached_byte_size_);
    }
    // repeated int32 repeated_int32_hifield = 1000002;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32_hifield(), 4,
              this_._impl_._repeated_int32_hifield_cached_byte_size_);
    }
    // repeated int32 packed_int32_hifield = 1000003 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32_hifield(), 4,
              this_._impl_._packed_int32_hifield_cached_byte_size_);
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // int32 optional_int32_lowfield = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32_lowfield());
    }
    // int32 optional_int32_midfield = 1001;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32_midfield());
    }
    // int32 other_field = 99;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_other_field());
    }
    // int32 optional_int32_hifield = 1000001;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 4 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32_hifield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}